

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O1

void gen_qemu_st32fs(DisasContext_conflict10 *ctx,TCGv_i64 src,TCGv_i64 addr)

{
  TCGContext_conflict10 *s;
  TCGTemp *ret;
  TCGTemp *args [1];
  TCGTemp *local_38;
  
  s = ctx->uc->tcg_ctx;
  ret = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I32,false);
  local_38 = (TCGTemp *)(src + (long)s);
  tcg_gen_callN_ppc64(s,helper_tosingle,ret,1,&local_38);
  tcg_gen_qemu_st_i32_ppc64
            (s,(TCGv_i32)((long)ret - (long)s),addr,(long)ctx->mem_idx,
             ctx->default_tcg_memop_mask | MO_32);
  tcg_temp_free_internal_ppc64(s,ret);
  return;
}

Assistant:

static void gen_qemu_st32fs(DisasContext *ctx, TCGv_i64 src, TCGv addr)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 tmp = tcg_temp_new_i32(tcg_ctx);
    gen_helper_tosingle(tcg_ctx, tmp, src);
    tcg_gen_qemu_st_i32(tcg_ctx, tmp, addr, ctx->mem_idx, DEF_MEMOP(MO_UL));
    tcg_temp_free_i32(tcg_ctx, tmp);
}